

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

int32_t u_strncmp_63(UChar *s1,UChar *s2,int32_t n)

{
  int iVar1;
  long lVar2;
  
  if (n < 1) {
    return 0;
  }
  iVar1 = (uint)(ushort)*s1 - (uint)(ushort)*s2;
  if (iVar1 == 0 && *s1 != L'\0') {
    lVar2 = 1;
    do {
      if (n == (int)lVar2) {
        return 0;
      }
      iVar1 = (uint)(ushort)s1[lVar2] - (uint)(ushort)s2[lVar2];
    } while ((s1[lVar2] != L'\0') && (lVar2 = lVar2 + 1, iVar1 == 0));
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t   U_EXPORT2
u_strncmp(const UChar     *s1, 
     const UChar     *s2, 
     int32_t     n) 
{
    if(n > 0) {
        int32_t rc;
        for(;;) {
            rc = (int32_t)*s1 - (int32_t)*s2;
            if(rc != 0 || *s1 == 0 || --n == 0) {
                return rc;
            }
            ++s1;
            ++s2;
        }
    } else {
        return 0;
    }
}